

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O3

ref<immutable::rrb_details::internal_node<int,_true>_> __thiscall
immutable::rrb_details::execute_concat_plan<int,true,5>
          (rrb_details *this,ref<immutable::rrb_details::internal_node<int,_true>_> *all,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *node_size,uint32_t slen,
          uint32_t shift)

{
  atomic<unsigned_int> *paVar1;
  size_t sVar2;
  rrb_size_table<true> *prVar3;
  rrb_size_table<true> *prVar4;
  uint uVar5;
  undefined4 *puVar6;
  internal_node<int,_true> *piVar7;
  char *__function;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  uint32_t uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  ref<immutable::rrb_details::leaf_node<int,_true>_> new_node;
  ref<immutable::rrb_details::leaf_node<int,_true>_> old;
  ref<immutable::rrb_details::internal_node<int,_true>_> local_90;
  ref<immutable::rrb_details::internal_node<int,_true>_> local_88;
  uint32_t local_80;
  uint local_7c;
  internal_node<int,_true> *local_78;
  ulong local_70;
  ref<immutable::rrb_details::internal_node<int,_true>_> *local_68;
  uint local_5c;
  undefined4 *local_58;
  ulong local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_48;
  ulong local_40;
  internal_node<int,_true> *local_38;
  
  local_50 = (ulong)slen;
  sVar2 = local_50 * 8;
  local_68 = all;
  local_48 = node_size;
  puVar6 = (undefined4 *)malloc(local_50 * 8 + 0x20);
  puVar6[1] = slen;
  *puVar6 = 1;
  *(undefined8 *)(puVar6 + 4) = 0;
  puVar6[3] = 0;
  *(undefined4 **)(puVar6 + 6) = puVar6 + 8;
  memset(puVar6 + 8,0,sVar2);
  *(undefined4 **)this = puVar6;
  LOCK();
  puVar6[2] = 1;
  UNLOCK();
  local_78 = (internal_node<int,_true> *)this;
  local_58 = puVar6;
  if (shift == 5) {
    if (slen != 0) {
      uVar8 = 0;
      uVar13 = 0;
      uVar11 = 0;
      local_80 = 5;
      do {
        if (local_68->ptr == (internal_node<int,_true> *)0x0) {
LAB_0011b52b:
          __function = 
          "T *immutable::ref<immutable::rrb_details::internal_node<int, true>>::operator->() const [T = immutable::rrb_details::internal_node<int, true>]"
          ;
LAB_0011b540:
          __assert_fail("ptr != nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                        ,0x71a,__function);
        }
        uVar15 = (local_48->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                 .super__Vector_impl_data._M_start[uVar8];
        local_88.ptr = local_68->ptr->child[uVar13].ptr;
        if (local_88.ptr == (internal_node<int,_true> *)0x0) {
          if (uVar11 == 0) {
LAB_0011b54a:
            __function = 
            "T *immutable::ref<immutable::rrb_details::leaf_node<int, true>>::operator->() const [T = immutable::rrb_details::leaf_node<int, true>]"
            ;
            goto LAB_0011b540;
          }
LAB_0011b11f:
          piVar7 = (internal_node<int,_true> *)malloc((ulong)uVar15 * 4 + 0x18);
          piVar7->len = uVar15;
          piVar7->type = LEAF_NODE;
          (piVar7->size_table).ptr = (rrb_size_table<true> *)&piVar7->child;
          piVar7->guid = 0;
          if (uVar15 == 0) {
            LOCK();
            (piVar7->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
            UNLOCK();
            local_90.ptr = piVar7;
          }
          else {
            uVar14 = 0;
            memset(&piVar7->child,0,(ulong)uVar15 * 4);
            LOCK();
            (piVar7->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
            UNLOCK();
            local_90.ptr = piVar7;
            do {
              if (local_68->ptr == (internal_node<int,_true> *)0x0) goto LAB_0011b52b;
              piVar7 = local_68->ptr->child[uVar13].ptr;
              if (piVar7 == (internal_node<int,_true> *)0x0) goto LAB_0011b54a;
              LOCK();
              (piVar7->_ref_count).super___atomic_base<unsigned_int>._M_i =
                   (piVar7->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
              UNLOCK();
              uVar5 = uVar15 - uVar14;
              if (uVar5 < piVar7->len - uVar11) {
                if (uVar15 != uVar14) {
                  if (local_90.ptr == (internal_node<int,_true> *)0x0) goto LAB_0011b54a;
                  prVar3 = (piVar7->size_table).ptr;
                  prVar4 = ((local_90.ptr)->size_table).ptr;
                  uVar9 = (ulong)uVar5;
                  uVar10 = uVar11;
                  do {
                    *(undefined4 *)((long)&prVar4->size + (ulong)uVar14 * 4) =
                         *(undefined4 *)((long)&prVar3->size + (ulong)uVar10 * 4);
                    uVar14 = uVar14 + 1;
                    uVar10 = uVar10 + 1;
                    uVar9 = uVar9 - 1;
                  } while (uVar9 != 0);
                }
                uVar11 = uVar11 + uVar5;
                uVar14 = uVar15;
              }
              else {
                uVar5 = 0;
                if (piVar7->len != uVar11) {
                  if (local_90.ptr == (internal_node<int,_true> *)0x0) goto LAB_0011b54a;
                  prVar3 = (piVar7->size_table).ptr;
                  prVar4 = ((local_90.ptr)->size_table).ptr;
                  uVar9 = 0;
                  do {
                    *(undefined4 *)((long)&prVar4->size + (ulong)(uVar14 + (int)uVar9) * 4) =
                         *(undefined4 *)((long)&prVar3->size + (ulong)(uVar11 + (int)uVar9) * 4);
                    uVar9 = uVar9 + 1;
                    uVar5 = piVar7->len - uVar11;
                  } while (uVar9 < uVar5);
                }
                uVar14 = uVar5 + uVar14;
                uVar13 = (ulong)((int)uVar13 + 1);
                uVar11 = 0;
              }
              paVar1 = &piVar7->_ref_count;
              LOCK();
              (paVar1->super___atomic_base<unsigned_int>)._M_i =
                   (paVar1->super___atomic_base<unsigned_int>)._M_i - 1;
              UNLOCK();
              if ((paVar1->super___atomic_base<unsigned_int>)._M_i == 0) {
                free(piVar7);
              }
            } while (uVar14 < uVar15);
          }
          if (*(long *)local_78 == 0) goto LAB_0011b52b;
          ref<immutable::rrb_details::internal_node<int,true>>::operator=
                    ((ref<immutable::rrb_details::internal_node<int,true>> *)
                     (uVar8 * 8 + *(long *)(*(long *)local_78 + 0x18)),
                     (ref<immutable::rrb_details::leaf_node<int,_true>_> *)&local_90);
          if (local_90.ptr != (internal_node<int,_true> *)0x0) {
            LOCK();
            paVar1 = &(local_90.ptr)->_ref_count;
            (paVar1->super___atomic_base<unsigned_int>)._M_i =
                 (paVar1->super___atomic_base<unsigned_int>)._M_i - 1;
            UNLOCK();
            if ((paVar1->super___atomic_base<unsigned_int>)._M_i == 0) {
              free(local_90.ptr);
            }
          }
        }
        else {
          LOCK();
          ((local_88.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
               ((local_88.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
          UNLOCK();
          if ((uVar11 != 0) || (uVar15 != (local_88.ptr)->len)) goto LAB_0011b11f;
          if (*(long *)local_78 == 0) goto LAB_0011b52b;
          ref<immutable::rrb_details::internal_node<int,true>>::operator=
                    ((ref<immutable::rrb_details::internal_node<int,true>> *)
                     (uVar8 * 8 + *(long *)(*(long *)local_78 + 0x18)),
                     (ref<immutable::rrb_details::leaf_node<int,_true>_> *)&local_88);
          uVar13 = (ulong)((int)uVar13 + 1);
          uVar11 = 0;
        }
        if (local_88.ptr != (internal_node<int,_true> *)0x0) {
          LOCK();
          paVar1 = &(local_88.ptr)->_ref_count;
          (paVar1->super___atomic_base<unsigned_int>)._M_i =
               (paVar1->super___atomic_base<unsigned_int>)._M_i - 1;
          UNLOCK();
          if ((paVar1->super___atomic_base<unsigned_int>)._M_i == 0) {
            free(local_88.ptr);
          }
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != local_50);
    }
  }
  else if (slen != 0) {
    local_80 = shift - 5;
    uVar8 = 0;
    uVar11 = 0;
    uVar13 = 0;
    do {
      if (local_68->ptr == (internal_node<int,_true> *)0x0) goto LAB_0011b52b;
      uVar15 = (local_48->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar8];
      local_70 = (ulong)uVar15;
      local_88.ptr = local_68->ptr->child[uVar11].ptr;
      if (local_88.ptr == (internal_node<int,_true> *)0x0) {
        if ((int)uVar13 == 0) goto LAB_0011b52b;
LAB_0011b34f:
        sVar2 = local_70 * 8;
        local_40 = uVar8;
        piVar7 = (internal_node<int,_true> *)malloc(local_70 * 8 + 0x20);
        piVar7->len = uVar15;
        piVar7->type = INTERNAL_NODE;
        (piVar7->size_table).ptr = (rrb_size_table<true> *)0x0;
        piVar7->guid = 0;
        piVar7->child = (ref<immutable::rrb_details::internal_node<int,_true>_> *)(piVar7 + 1);
        uVar15 = 0;
        memset(piVar7 + 1,0,sVar2);
        LOCK();
        (piVar7->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
        UNLOCK();
        local_90.ptr = piVar7;
        while (uVar14 = (uint)local_70 - uVar15, uVar15 <= (uint)local_70 && uVar14 != 0) {
          if ((local_68->ptr == (internal_node<int,_true> *)0x0) ||
             (piVar7 = local_68->ptr->child[uVar11].ptr, piVar7 == (internal_node<int,_true> *)0x0))
          goto LAB_0011b52b;
          LOCK();
          (piVar7->_ref_count).super___atomic_base<unsigned_int>._M_i =
               (piVar7->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
          UNLOCK();
          uVar12 = (uint32_t)uVar13;
          local_7c = uVar11;
          if (uVar14 < piVar7->len - uVar12) {
            uVar8 = (ulong)uVar14;
            local_5c = uVar14;
            do {
              if (local_90.ptr == (internal_node<int,_true> *)0x0) goto LAB_0011b52b;
              ref<immutable::rrb_details::internal_node<int,_true>_>::operator=
                        ((local_90.ptr)->child + uVar15,piVar7->child + uVar13);
              uVar15 = uVar15 + 1;
              uVar13 = (ulong)((int)uVar13 + 1);
              uVar8 = uVar8 - 1;
            } while (uVar8 != 0);
            uVar13 = (ulong)(local_5c + uVar12);
            uVar15 = (uint)local_70;
            uVar11 = local_7c;
          }
          else {
            uVar11 = 0;
            if (piVar7->len != uVar12) {
              uVar8 = 0;
              do {
                if (local_90.ptr == (internal_node<int,_true> *)0x0) goto LAB_0011b52b;
                ref<immutable::rrb_details::internal_node<int,_true>_>::operator=
                          ((local_90.ptr)->child + ((int)uVar8 + uVar15),
                           piVar7->child + (uVar12 + (int)uVar8));
                uVar8 = uVar8 + 1;
                uVar11 = piVar7->len - uVar12;
              } while (uVar8 < uVar11);
            }
            uVar15 = uVar11 + uVar15;
            uVar11 = local_7c + 1;
            uVar13 = 0;
          }
          release<int>(piVar7);
        }
        set_sizes<int,true,5>((rrb_details *)&local_38,&local_90,local_80);
        uVar8 = local_40;
        release<int>(local_38);
        ref<immutable::rrb_details::internal_node<int,_true>_>::operator=
                  ((ref<immutable::rrb_details::internal_node<int,_true>_> *)
                   (uVar8 * 8 + *(long *)(local_58 + 6)),&local_90);
        release<int>(local_90.ptr);
      }
      else {
        LOCK();
        ((local_88.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
             ((local_88.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
        UNLOCK();
        if (((int)uVar13 != 0) || (uVar15 != (local_88.ptr)->len)) goto LAB_0011b34f;
        ref<immutable::rrb_details::internal_node<int,_true>_>::operator=
                  ((ref<immutable::rrb_details::internal_node<int,_true>_> *)
                   (uVar8 * 8 + *(long *)(local_58 + 6)),&local_88);
        uVar11 = uVar11 + 1;
        uVar13 = 0;
      }
      release<int>(local_88.ptr);
      uVar8 = uVar8 + 1;
    } while (uVar8 != local_50);
  }
  return (ref<immutable::rrb_details::internal_node<int,_true>_>)local_78;
}

Assistant:

inline ref<internal_node<T, atomic_ref_counting>> execute_concat_plan(const ref<internal_node<T, atomic_ref_counting>>& all, const std::vector<uint32_t>& node_size, uint32_t slen, uint32_t shift)
      {
      // the all vector doesn't have sizes set yet.

      ref<internal_node<T, atomic_ref_counting>> new_all = internal_node_create<T, atomic_ref_counting>(slen);
      // Current old node index to copy from
      uint32_t idx = 0;

      // Offset is how long into the current old node we've already copied from
      uint32_t offset = 0;

      if (shift == bits<N>::rrb_bits)
        { // handle leaf nodes here
        for (uint32_t i = 0; i < slen; i++)
          {
          const uint32_t new_size = node_size[i];
          ref<leaf_node<T, atomic_ref_counting>> old = all->child[idx];

          if (offset == 0 && new_size == old->len)
            {
            // just pointer copy the node if there is no offset and both have same
            // size
            idx++;
            new_all->child[i] = old;
            }
          else
            {
            ref<leaf_node<T, atomic_ref_counting>> new_node = leaf_node_create<T, atomic_ref_counting>(new_size);
            uint32_t cur_size = 0;
            // cur_size is the current size of the new node
            // (the amount of elements copied into it so far)

            while (cur_size < new_size /*&& idx < all->len*/)
              {
              // the commented out check is verified by create_concat_plan --
              // otherwise the implementation is erroneous!
              ref<leaf_node<T, atomic_ref_counting>> old_node = all->child[idx];

              if (new_size - cur_size >= old_node->len - offset)
                {
                // if this node can contain all elements not copied in the old node,
                // copy all of them into this node

                //memcpy(&new_node->child[cur_size], &old_node->child[offset], (old_node->len - offset) * sizeof(T));
                for (uint32_t j = 0; j < old_node->len - offset; ++j)
                  new_node->child[cur_size + j] = old_node->child[offset + j]; // don't memcpy, but use copy constructor

                cur_size += old_node->len - offset;
                idx++;
                offset = 0;
                }
              else
                {
                // if this node can't contain all the elements not copied in the old
                // node, copy as many as we can and pass the old node over to the
                // new node after this one.

                //memcpy(&new_node->child[cur_size], &old_node->child[offset], (new_size - cur_size) * sizeof(T));
                for (uint32_t j = 0; j < new_size - cur_size; ++j)
                  new_node->child[cur_size + j] = old_node->child[offset + j]; // don't memcpy, but use copy constructor

                offset += new_size - cur_size;
                cur_size = new_size;
                }
              }

            new_all->child[i] = new_node;
            }
          }
        }
      else
        { // not at lowest non-leaf level
        // this is ALMOST equivalent with the leaf node copying, the only difference
        // is that this is with internal nodes and the fact that they have to create
        // their size tables.

        // As that's the only difference, I won't bother with comments here.
        for (uint32_t i = 0; i < slen; i++)
          {
          const uint32_t new_size = node_size[i];
          ref<internal_node<T, atomic_ref_counting>> old = all->child[idx];

          if (offset == 0 && new_size == old->len)
            {
            idx++;
            new_all->child[i] = old;
            }
          else
            {
            ref<internal_node<T, atomic_ref_counting>> new_node = internal_node_create<T, atomic_ref_counting>(new_size);
            uint32_t cur_size = 0;
            while (cur_size < new_size)
              {
              ref<internal_node<T, atomic_ref_counting>> old_node = all->child[idx];

              if (new_size - cur_size >= old_node->len - offset)
                {
                for (uint32_t k = 0; k < (old_node->len - offset); ++k)
                  new_node->child[cur_size + k] = old_node->child[offset + k];

                cur_size += old_node->len - offset;
                idx++;
                offset = 0;
                }
              else
                {
                for (uint32_t k = 0; k < (new_size - cur_size); ++k)
                  new_node->child[cur_size + k] = old_node->child[offset + k];

                offset += new_size - cur_size;
                cur_size = new_size;
                }
              }
            set_sizes<T, atomic_ref_counting, N>(new_node, shift - bits<N>::rrb_bits); // This is where we set sizes
            new_all->child[i] = new_node;
            }
          }
        }
      return new_all;
      }